

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EnumValueSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::EnumValueSymbol,char_const*&,slang::SourceLocation_const&>
          (BumpAllocator *this,char **args,SourceLocation *args_1)

{
  char *__s;
  size_t sVar1;
  EnumValueSymbol *this_00;
  string_view name;
  
  this_00 = (EnumValueSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EnumValueSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (EnumValueSymbol *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  __s = *args;
  sVar1 = strlen(__s);
  name._M_str = __s;
  name._M_len = sVar1;
  ast::EnumValueSymbol::EnumValueSymbol(this_00,name,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }